

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void affect_strip_room(ROOM_INDEX_DATA *room,int sn)

{
  ROOM_AFFECT_DATA *pRVar1;
  ROOM_AFFECT_DATA *paf;
  
  pRVar1 = room->affected;
  while (paf = pRVar1, paf != (ROOM_AFFECT_DATA *)0x0) {
    pRVar1 = paf->next;
    if (paf->type == sn) {
      affect_remove_room(room,paf);
    }
  }
  return;
}

Assistant:

void affect_strip_room(ROOM_INDEX_DATA *room, int sn)
{
	ROOM_AFFECT_DATA *paf;
	ROOM_AFFECT_DATA *paf_next;

	for (paf = room->affected; paf != nullptr; paf = paf_next)
	{
		paf_next = paf->next;

		if (paf->type == sn)
			affect_remove_room(room, paf);
	}
}